

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3da::NinjaMain::NinjaMain
          (NinjaMain *this,char *ninja_command,BuildConfig *config)

{
  int64_t iVar1;
  
  (this->super_BuildLogUser)._vptr_BuildLogUser = (_func_int **)&PTR_IsPathDead_0013e860;
  this->ninja_command_ = ninja_command;
  this->config_ = config;
  State::State(&this->state_);
  (this->disk_interface_).super_DiskInterface.super_FileReader._vptr_FileReader =
       (_func_int **)&PTR__FileReader_0013e9c0;
  (this->build_dir_)._M_dataplus._M_p = (pointer)&(this->build_dir_).field_2;
  (this->build_dir_)._M_string_length = 0;
  (this->build_dir_).field_2._M_local_buf[0] = '\0';
  BuildLog::BuildLog(&this->build_log_);
  (this->deps_log_).needs_recompaction_ = false;
  (this->deps_log_).file_ = (FILE *)0x0;
  (this->deps_log_).file_path_._M_dataplus._M_p = (pointer)&(this->deps_log_).file_path_.field_2;
  (this->deps_log_).file_path_._M_string_length = 0;
  (this->deps_log_).file_path_.field_2._M_local_buf[0] = '\0';
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deps_log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->deps_log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = GetTimeMillis();
  this->start_time_millis_ = iVar1;
  return;
}

Assistant:

NinjaMain(const char* ninja_command, const BuildConfig& config) :
      ninja_command_(ninja_command), config_(config),
      start_time_millis_(GetTimeMillis()) {}